

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

void __thiscall SqlGenerator::generateAggregateQueries(SqlGenerator *this)

{
  pointer ppAVar1;
  Aggregate *pAVar2;
  long lVar3;
  bool bVar4;
  size_t sVar5;
  Query *pQVar6;
  Attribute *pAVar7;
  Function *pFVar8;
  size_t var;
  size_t i;
  ulong uVar9;
  ulong uVar10;
  unsigned_long uVar11;
  __node_base _Var12;
  pair<std::__detail::_Node_iterator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>,_bool>
  pVar13;
  ulong local_4d0;
  unsigned_long local_4c8;
  unsigned_long local_4c0;
  string sumString;
  string prodString;
  string sumString_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string local_428;
  string prodString_1;
  string local_3e8;
  string joinString;
  string aggregateString;
  string local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string attributeString;
  unordered_map<std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::bitset<100UL>_>,_std::equal_to<std::bitset<100UL>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fVarAggregateMap;
  ofstream ofs;
  string local_220 [496];
  
  std::__cxx11::string::string((string *)&joinString,"",(allocator *)&ofs);
  std::__cxx11::string::string((string *)&attributeString,"",(allocator *)&ofs);
  uVar9 = 0;
  while( true ) {
    sVar5 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    if (sVar5 <= uVar9) break;
    TreeDecomposition::getRelation
              ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               uVar9);
    std::__cxx11::string::append((string *)&joinString);
    sVar5 = TreeDecomposition::numberOfRelations
                      ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
    uVar9 = uVar9 + 1;
    if (uVar9 < sVar5) {
      std::__cxx11::string::append((char *)&joinString);
    }
  }
  fVarAggregateMap._M_h._M_buckets = &fVarAggregateMap._M_h._M_single_bucket;
  fVarAggregateMap._M_h._M_bucket_count = 1;
  fVarAggregateMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  fVarAggregateMap._M_h._M_element_count = 0;
  fVarAggregateMap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  fVarAggregateMap._M_h._M_rehash_policy._M_next_resize = 0;
  fVarAggregateMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_4d0 = 0;
  local_4c0 = 0;
  while( true ) {
    sVar5 = QueryCompiler::numberOfQueries
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar5 <= local_4d0) break;
    pQVar6 = QueryCompiler::getQuery
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_4d0);
    std::__cxx11::string::string((string *)&aggregateString,"",(allocator *)&ofs);
    uVar9 = 0;
    while( true ) {
      ppAVar1 = (pQVar6->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pQVar6->_aggregates).
                        super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3) <= uVar9) break;
      pAVar2 = ppAVar1[uVar9];
      std::__cxx11::string::string((string *)&sumString,"",(allocator *)&ofs);
      for (uVar10 = 0;
          lVar3 = *(long *)&(pAVar2->_agg).
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl,
          uVar10 < (ulong)(((long)*(pointer *)
                                   ((long)&(pAVar2->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl + 8) - lVar3) / 0xc0); uVar10 = uVar10 + 1) {
        memcpy((pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&ofs,(void *)(lVar3 + uVar10 * 0xc0),0xc0);
        std::__cxx11::string::string((string *)&prodString,"",(allocator *)&sumString_1);
        for (sVar5 = 0; sVar5 != 0x5dc; sVar5 = sVar5 + 1) {
          bVar4 = std::bitset<1500UL>::test((bitset<1500UL> *)&ofs,sVar5);
          if (bVar4) {
            getFunctionString_abi_cxx11_(&prodString_1,this,sVar5);
            std::operator+(&sumString_1,&prodString_1,"*");
            std::__cxx11::string::append((string *)&prodString);
            std::__cxx11::string::~string((string *)&sumString_1);
            std::__cxx11::string::~string((string *)&prodString_1);
          }
        }
        if (prodString._M_string_length == 0) {
          std::__cxx11::string::append((char *)&prodString);
        }
        else {
          std::__cxx11::string::pop_back();
        }
        std::operator+(&sumString_1,&prodString,"+");
        std::__cxx11::string::append((string *)&sumString);
        std::__cxx11::string::~string((string *)&sumString_1);
        std::__cxx11::string::~string((string *)&prodString);
      }
      std::__cxx11::string::pop_back();
      std::operator+(&prodString_1,"SUM(",&sumString);
      std::operator+(&sumString_1,&prodString_1,") AS agg_");
      std::__cxx11::to_string(&local_428,local_4c0);
      std::operator+(&prodString,&sumString_1,&local_428);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                     &prodString,",");
      std::__cxx11::string::append((string *)&aggregateString);
      local_4c0 = local_4c0 + 1;
      std::__cxx11::string::~string((string *)&ofs);
      std::__cxx11::string::~string((string *)&prodString);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&sumString_1);
      std::__cxx11::string::~string((string *)&prodString_1);
      std::__cxx11::string::~string((string *)&sumString);
      uVar9 = uVar9 + 1;
    }
    std::
    pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::bitset<100UL>_&,_const_char_(&)[1],_true>
              ((pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&ofs,&pQVar6->_fVars,(char (*) [1])0x1e2d3a);
    pVar13 = std::
             _Hashtable<std::bitset<100ul>,std::pair<std::bitset<100ul>const,std::__cxx11::string>,std::allocator<std::pair<std::bitset<100ul>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::bitset<100ul>>,std::hash<std::bitset<100ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<std::pair<std::bitset<100ul>const,std::__cxx11::string>>
                       ((_Hashtable<std::bitset<100ul>,std::pair<std::bitset<100ul>const,std::__cxx11::string>,std::allocator<std::pair<std::bitset<100ul>const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::bitset<100ul>>,std::hash<std::bitset<100ul>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&fVarAggregateMap,
                        (pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&ofs);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::string::append
              ((string *)
               ((long)pVar13.first.
                      super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               + 0x18));
    std::__cxx11::string::~string((string *)&aggregateString);
    local_4d0 = local_4d0 + 1;
  }
  std::operator+(&aggregateString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/aggregates_merged.sql");
  std::ofstream::ofstream(&ofs,(string *)&aggregateString,_S_out);
  std::__cxx11::string::~string((string *)&aggregateString);
  local_4c8 = 0;
  for (_Var12 = fVarAggregateMap._M_h._M_before_begin; _Var12._M_nxt != (_Hash_node_base *)0x0;
      _Var12._M_nxt = (_Var12._M_nxt)->_M_nxt) {
    std::__cxx11::string::string((string *)&aggregateString,"",(allocator *)&sumString);
    for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
      if (((ulong)_Var12._M_nxt[(uVar9 >> 6) + 1]._M_nxt >> (uVar9 & 0x3f) & 1) != 0) {
        pAVar7 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar9);
        std::operator+(&sumString,&pAVar7->_name,",");
        std::__cxx11::string::append((string *)&aggregateString);
        std::__cxx11::string::~string((string *)&sumString);
      }
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::to_string(&local_3e8,local_4c8);
    std::operator+(&local_448,"CREATE TABLE agg_",&local_3e8);
    std::operator+(&local_428,&local_448," AS (\nSELECT ");
    std::operator+(&prodString_1,&local_428,&aggregateString);
    std::operator+(&sumString_1,&prodString_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (_Var12._M_nxt + 3));
    std::operator+(&prodString,&sumString_1,"\nFROM ");
    std::operator+(&sumString,&prodString,&joinString);
    std::operator<<((ostream *)&ofs,(string *)&sumString);
    std::__cxx11::string::~string((string *)&sumString);
    std::__cxx11::string::~string((string *)&prodString);
    std::__cxx11::string::~string((string *)&sumString_1);
    std::__cxx11::string::~string((string *)&prodString_1);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_3e8);
    if (aggregateString._M_string_length != 0) {
      std::__cxx11::string::pop_back();
      std::operator+(&sumString,"\nGROUP BY ",&aggregateString);
      std::operator<<((ostream *)&ofs,(string *)&sumString);
      std::__cxx11::string::~string((string *)&sumString);
    }
    std::operator<<((ostream *)&ofs,");\n\n");
    local_4c8 = local_4c8 + 1;
    std::__cxx11::string::~string((string *)&aggregateString);
  }
  std::ofstream::close();
  std::operator+(&aggregateString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/aggregates.sql");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&aggregateString);
  std::__cxx11::string::~string((string *)&aggregateString);
  local_4d0 = 0;
  while( true ) {
    sVar5 = QueryCompiler::numberOfQueries
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    if (sVar5 <= local_4d0) break;
    pQVar6 = QueryCompiler::getQuery
                       ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,local_4d0);
    std::__cxx11::string::string((string *)&sumString,"",(allocator *)&aggregateString);
    for (uVar9 = 0; uVar9 != 100; uVar9 = uVar9 + 1) {
      if (((pQVar6->_fVars).super__Base_bitset<2UL>._M_w[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        pAVar7 = TreeDecomposition::getAttribute
                           ((this->_td).
                            super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                            ,uVar9);
        std::operator+(&aggregateString,&pAVar7->_name,",");
        std::__cxx11::string::append((string *)&sumString);
        std::__cxx11::string::~string((string *)&aggregateString);
      }
    }
    std::__cxx11::string::string((string *)&prodString,"",(allocator *)&aggregateString);
    for (uVar9 = 0;
        ppAVar1 = (pQVar6->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)(pQVar6->_aggregates).
                              super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppAVar1 >> 3);
        uVar9 = uVar9 + 1) {
      pAVar2 = ppAVar1[uVar9];
      std::__cxx11::string::string((string *)&sumString_1,"",(allocator *)&aggregateString);
      for (uVar10 = 0;
          lVar3 = *(long *)&(pAVar2->_agg).
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl,
          uVar10 < (ulong)(((long)*(pointer *)
                                   ((long)&(pAVar2->_agg).
                                           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                           ._M_impl + 8) - lVar3) / 0xc0); uVar10 = uVar10 + 1) {
        memcpy(&aggregateString,(void *)(lVar3 + uVar10 * 0xc0),0xc0);
        std::__cxx11::string::string((string *)&prodString_1,"",(allocator *)&local_428);
        for (sVar5 = 0; sVar5 != 0x5dc; sVar5 = sVar5 + 1) {
          bVar4 = std::bitset<1500UL>::test((bitset<1500UL> *)&aggregateString,sVar5);
          if (bVar4) {
            pFVar8 = QueryCompiler::getFunction
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                ,sVar5);
            if (pFVar8->_operation != dynamic) {
              getFunctionString_abi_cxx11_(&local_448,this,sVar5);
              std::operator+(&local_428,&local_448,"*");
              std::__cxx11::string::append((string *)&prodString_1);
              std::__cxx11::string::~string((string *)&local_428);
              std::__cxx11::string::~string((string *)&local_448);
            }
          }
        }
        if (prodString_1._M_string_length == 0) {
          std::__cxx11::string::append((char *)&prodString_1);
        }
        else {
          std::__cxx11::string::pop_back();
        }
        std::operator+(&local_428,&prodString_1,"+");
        std::__cxx11::string::append((string *)&sumString_1);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&prodString_1);
      }
      std::__cxx11::string::pop_back();
      std::operator+(&local_448,"SUM(",&sumString_1);
      std::operator+(&local_428,&local_448,") AS agg_");
      std::__cxx11::to_string(&local_3e8,uVar9);
      std::operator+(&prodString_1,&local_428,&local_3e8);
      std::operator+(&aggregateString,&prodString_1,",");
      std::__cxx11::string::append((string *)&prodString);
      std::__cxx11::string::~string((string *)&aggregateString);
      std::__cxx11::string::~string((string *)&prodString_1);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&sumString_1);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::string((string *)&aggregateString,"",(allocator *)&sumString_1);
    if (sumString._M_string_length != 0) {
      std::operator+(&sumString_1,&sumString,&prodString);
      std::__cxx11::string::operator=((string *)&prodString,(string *)&sumString_1);
      std::__cxx11::string::~string((string *)&sumString_1);
      std::__cxx11::string::pop_back();
      std::operator+(&sumString_1,"\nGROUP BY ",&sumString);
      std::__cxx11::string::append((string *)&aggregateString);
      std::__cxx11::string::~string((string *)&sumString_1);
    }
    std::__cxx11::to_string(&local_2e8,local_4d0);
    std::operator+(&local_2c8,"CREATE TABLE agg_",&local_2e8);
    std::operator+(&local_2a8,&local_2c8," AS (\nSELECT ");
    std::operator+(&local_3e8,&local_2a8,&prodString);
    std::operator+(&local_448,&local_3e8,"\nFROM ");
    std::operator+(&local_428,&local_448,&joinString);
    std::operator+(&prodString_1,&local_428,&aggregateString);
    std::operator+(&sumString_1,&prodString_1,");\n\n");
    std::operator<<((ostream *)&ofs,(string *)&sumString_1);
    local_4d0 = local_4d0 + 1;
    std::__cxx11::string::~string((string *)&sumString_1);
    std::__cxx11::string::~string((string *)&prodString_1);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&aggregateString);
    std::__cxx11::string::~string((string *)&prodString);
    std::__cxx11::string::~string((string *)&sumString);
  }
  std::ofstream::close();
  std::operator+(&aggregateString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/aggregate_merged_cleanup.sql");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&aggregateString);
  std::__cxx11::string::~string((string *)&aggregateString);
  for (uVar11 = 0; local_4c8 != uVar11; uVar11 = uVar11 + 1) {
    std::__cxx11::to_string(&prodString,uVar11);
    std::operator+(&sumString,"DROP TABLE IF EXISTS agg_",&prodString);
    std::operator+(&aggregateString,&sumString,";\n");
    std::operator<<((ostream *)&ofs,(string *)&aggregateString);
    std::__cxx11::string::~string((string *)&aggregateString);
    std::__cxx11::string::~string((string *)&sumString);
    std::__cxx11::string::~string((string *)&prodString);
  }
  std::ofstream::close();
  std::operator+(&aggregateString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"/aggregate_cleanup.sql");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&aggregateString);
  std::__cxx11::string::~string((string *)&aggregateString);
  for (uVar11 = 0; local_4d0 != uVar11; uVar11 = uVar11 + 1) {
    std::__cxx11::to_string(&prodString,uVar11);
    std::operator+(&sumString,"DROP TABLE IF EXISTS agg_",&prodString);
    std::operator+(&aggregateString,&sumString,";\n");
    std::operator<<((ostream *)&ofs,(string *)&aggregateString);
    std::__cxx11::string::~string((string *)&aggregateString);
    std::__cxx11::string::~string((string *)&sumString);
    std::__cxx11::string::~string((string *)&prodString);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::
  _Hashtable<std::bitset<100UL>,_std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::bitset<100UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<100UL>_>,_std::hash<std::bitset<100UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&fVarAggregateMap._M_h);
  std::__cxx11::string::~string((string *)&attributeString);
  std::__cxx11::string::~string((string *)&joinString);
  return;
}

Assistant:

void SqlGenerator::generateAggregateQueries()
{
    string joinString = "", attributeString  = "";
    
    for (size_t rel = 0; rel < _td->numberOfRelations(); ++rel)
    {    
        joinString += _td->getRelation(rel)->_name;
        if (rel + 1 < _td->numberOfRelations())
            joinString += " NATURAL JOIN ";
    }
    
    // for (size_t var = 0; var < _td->numberOfAttributes(); ++var)
    //     attributeString += _td->getAttribute(var)->_name + ",";
    // attributeString.pop_back();
    
    //********** TODO: TODO: ********** 
    // technically we need to join in the parameters
    // for now we just fix the params
    //********** TODO: TODO: **********
    // TODO: TODO: TODO: THIS SHOULD REALLY BE LINEARREGRESSION GRADIENT
    // TODO: TODO: TODO: Commenting out for now
    // if (false && _model == LinearRegressionModel)
    // {
    //     // Add parameters to the join string !
    //     var_bitset features = _app->getFeatures();

    //     const var_bitset categoricalFeatures =
    //         static_pointer_cast<LinearRegression>(_app)->
    //         getCategoricalFeatures();
        
    //     std::string catParams = "", contParams = "";
    //     for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    //     {
    //         if (features[var])
    //         {
    //             Attribute* attr = _td->getAttribute(var);

    //             if (categoricalFeatures[var])
    //                 catParams += " NATURAL JOIN "+attr->_name+"_param";
    //             else
    //                 contParams += ","+attr->_name+"_param";
    //         }
    //     }
        
    //     joinString += catParams + contParams;
    // }

    unordered_map<var_bitset,string> fVarAggregateMap;

    size_t aggNum = 0;
    
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);
        
        std::string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f))
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();
            aggregateString += "SUM("+sumString+") AS agg_"+to_string(aggNum++)+",";
        }

        auto it_pair = fVarAggregateMap.insert({query->_fVars,""});
        it_pair.first->second += aggregateString;        
    }

    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates_merged.sql", std::ofstream::out);

    size_t aggID = 0;
    for (auto& fvarAggPair : fVarAggregateMap)
    {
        string fVarString = "";
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (fvarAggPair.first[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        fvarAggPair.second.pop_back();
        
        ofs << "CREATE TABLE agg_"+to_string(aggID++)+" AS (\n" 
            "SELECT "+fVarString+fvarAggPair.second+"\nFROM "+joinString;
        if (!fVarString.empty())
        {
            fVarString.pop_back();
            ofs << "\nGROUP BY "+fVarString;
        }
        ofs << ");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregates.sql", std::ofstream::out);

    size_t aggID_unmerged = 0;
    for (size_t queryID = 0; queryID < _qc->numberOfQueries(); ++queryID)
    {
        Query* query = _qc->getQuery(queryID);

        string fVarString = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (query->_fVars[var])
                fVarString += _td->getAttribute(var)->_name + ",";
        }

        string aggregateString = "";
        for (size_t agg = 0; agg < query->_aggregates.size(); ++agg)
        {
            Aggregate* aggregate = query->_aggregates[agg];
            
            size_t aggIdx = 0;

            string sumString = "";
            for (size_t i = 0; i < aggregate->_agg.size(); i++)
            {
                const prod_bitset prod = aggregate->_agg[aggIdx];

                string prodString = "";
                for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
                {
                    if (prod.test(f) &&
                        _qc->getFunction(f)->_operation != Operation::dynamic)
                    {
                        prodString += getFunctionString(f)+"*";
                    }
                }

                if (!prodString.empty())
                    prodString.pop_back();
                else
                    prodString += "1";
                
                sumString += prodString+"+";
                ++aggIdx;
            }
            sumString.pop_back();

            aggregateString +="SUM("+sumString+") AS agg_"+to_string(agg)+",";
        }
        aggregateString.pop_back();
        
        std::string groupByString = "";
        if (!fVarString.empty())
        {
            aggregateString = fVarString+aggregateString;
            fVarString.pop_back();
            groupByString += "\nGROUP BY "+fVarString;
        }
        
        ofs << "CREATE TABLE agg_"+to_string(aggID_unmerged++)+" AS (\nSELECT "+
            aggregateString+"\nFROM "+joinString+groupByString+");\n\n";
    }

    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_merged_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"/aggregate_cleanup.sql", std::ofstream::out);
    for (size_t i = 0; i < aggID_unmerged; ++i)
        ofs << "DROP TABLE IF EXISTS agg_"+to_string(i)+";\n";
    ofs.close();


}